

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

Var Js::JavascriptProxy::EntryRevoke(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  CallInfo aValue;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  JavascriptProxy *pJVar9;
  int in_stack_00000010;
  undefined1 local_78 [8];
  ArgumentReader args;
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  Var revokableProxy;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x93,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00cf6bbb;
    *puVar7 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_78 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_78,(CallInfo *)&__tag.entry.next);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)&args.super_Arguments.Values,function,
             (CallInfo)__tag.entry.next,L"Proxy.revoke",&stack0x00000000);
  if (((ulong)local_78 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x97,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar4) goto LAB_00cf6bbb;
    *puVar7 = 0;
  }
  iVar5 = (*(function->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x14])(function,function,0xd,&callInfo_local,0,pSVar2);
  aValue = callInfo_local;
  if (iVar5 == 0) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea17,L"");
  }
  if (callInfo_local == (CallInfo)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00cf6bbb;
    *puVar7 = 0;
  }
  else {
    if (((ulong)callInfo_local & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)callInfo_local & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00cf6bbb;
      *puVar7 = 0;
      goto LAB_00cf6ba7;
    }
    if (((ulong)callInfo_local >> 0x32 != 0) ||
       (((ulong)callInfo_local & 0xffff000000000000) == 0x1000000000000)) goto LAB_00cf6ba7;
  }
  pRVar8 = UnsafeVarTo<Js::RecyclableObject>((Var)aValue);
  if (pRVar8 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00cf6bbb;
    *puVar7 = 0;
  }
  TVar1 = ((pRVar8->type).ptr)->typeId;
  if ((0x57 < (int)TVar1) && (BVar6 = RecyclableObject::IsExternal(pRVar8), BVar6 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar4) {
LAB_00cf6bbb:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  if (TVar1 == TypeIds_Proxy) {
    (*(function->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x19])(function,0xd,
              (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
              nullValue.ptr,8,0);
    pJVar9 = VarTo<Js::JavascriptProxy>((Var)callInfo_local);
    (pJVar9->handler).ptr = (RecyclableObject *)0x0;
    (pJVar9->target).ptr = (RecyclableObject *)0x0;
  }
  else if (TVar1 != TypeIds_Null) {
LAB_00cf6ba7:
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea17,L"");
  }
  pRVar8 = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)&args.super_Arguments.Values);
  return pRVar8;
}

Assistant:

Var JavascriptProxy::EntryRevoke(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Proxy.revoke"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        Var revokableProxy;
        if (!function->GetInternalProperty(function, Js::InternalPropertyIds::RevocableProxy, &revokableProxy, nullptr, scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidProxyArgument, _u(""));
        }
        TypeId typeId = JavascriptOperators::GetTypeId(revokableProxy);
        if (typeId == TypeIds_Null)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        if (typeId != TypeIds_Proxy)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidProxyArgument, _u(""));
        }
        function->SetInternalProperty(Js::InternalPropertyIds::RevocableProxy, scriptContext->GetLibrary()->GetNull(), PropertyOperationFlags::PropertyOperation_Force, nullptr);
        (VarTo<JavascriptProxy>(revokableProxy))->RevokeObject();

        return scriptContext->GetLibrary()->GetUndefined();
    }